

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.cpp
# Opt level: O2

void __thiscall
MinVR::VRDisplayNode::waitForRenderToComplete(VRDisplayNode *this,VRDataIndex *renderState)

{
  pointer ppVVar1;
  
  for (ppVVar1 = (this->_children).
                 super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppVVar1 !=
      (this->_children).
      super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppVVar1 = ppVVar1 + 1) {
    (*(*ppVVar1)->_vptr_VRDisplayNode[5])(*ppVVar1,renderState);
  }
  return;
}

Assistant:

void VRDisplayNode::waitForRenderToComplete(VRDataIndex *renderState) {
	for (std::vector<VRDisplayNode*>::iterator it = _children.begin(); it != _children.end(); it++) {
		(*it)->waitForRenderToComplete(renderState);
	}
}